

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double deranged_cdf(int x,int a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int n;
  int k;
  double dVar4;
  
  dVar4 = 0.0;
  if (x <= a && -1 < x) {
    k = 0;
    iVar3 = 0;
    n = a;
    do {
      iVar1 = i4_choose(a,k);
      iVar2 = deranged_enum(n);
      iVar3 = iVar3 + iVar2 * iVar1;
      k = k + 1;
      n = n + -1;
    } while (x + 1 != k);
    dVar4 = r8_factorial(a);
    dVar4 = (double)iVar3 / dVar4;
  }
  return dVar4;
}

Assistant:

double deranged_cdf ( int x, int a )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_CDF evaluates the Deranged CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the maximum number of items in their correct places.
//    0 <= X <= A.
//
//    Input, int A, the number of items.
//    1 <= A.
//
//    Output, double CDF, the value of the CDF.
//
{
  double cdf;
  int cnk;
  int dnmk;
  int sum2;
  int x2;

  if ( x < 0 || a < x )
  {
    cdf = 0.0;
  }
  else
  {
    sum2 = 0;
    for ( x2 = 0; x2 <= x; x2++ )
    {
      cnk = i4_choose ( a, x2 );
      dnmk = deranged_enum ( a - x2 );
      sum2 = sum2 + cnk * dnmk;
    }
    cdf = static_cast<double>(sum2 ) / r8_factorial ( a );
  }

  return cdf;
}